

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_D3D_opcode_dsss(Context *ctx,char *opcode)

{
  char cVar1;
  long lVar2;
  int i;
  size_t sVar3;
  long lVar4;
  size_t in_RDX;
  char *pcVar5;
  char cVar6;
  undefined8 auStack_140 [3];
  char local_128 [8];
  char src1 [64];
  char src2 [64];
  char dst [64];
  char src0 [64];
  
  auStack_140[2] = 0x11d661;
  make_D3D_destarg_string(ctx,src2 + 0x38,in_RDX);
  auStack_140[2] = 0x11d679;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args,dst + 0x38,0x40);
  auStack_140[2] = 0x11d697;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args + 1,local_128,0x40);
  auStack_140[2] = 0x11d6b5;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args + 2,src1 + 0x38,0x40);
  auStack_140[2] = 0x11d6bd;
  sVar3 = strlen(opcode);
  lVar2 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
  lVar4 = 0;
  do {
    cVar1 = opcode[lVar4];
    cVar6 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar6 = cVar1;
    }
    (local_128 + lVar2)[lVar4] = cVar6;
    lVar4 = lVar4 + 1;
  } while (cVar1 != '\0');
  pcVar5 = "+";
  if (ctx->coissue == 0) {
    pcVar5 = "";
  }
  *(char **)((long)auStack_140 + lVar2 + 0x10) = src1 + 0x38;
  *(char **)((long)auStack_140 + lVar2 + 8) = local_128;
  *(undefined8 *)((long)auStack_140 + lVar2) = 0x11d72a;
  output_line(ctx,"%s%s%s, %s, %s, %s",pcVar5,local_128 + lVar2,src2 + 0x38,dst + 0x38);
  return;
}

Assistant:

static void emit_D3D_opcode_dsss(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_D3D_srcarg_string(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_D3D_srcarg_string(ctx, 2, src2, sizeof (src2));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s, %s, %s, %s", ctx->coissue ? "+" : "", 
                opcode, dst, src0, src1, src2);
}